

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor)

{
  int iVar1;
  int iVar2;
  
  *(int *)&pCursor[3].pVtab = *(int *)&pCursor[3].pVtab + 1;
  iVar1 = (*(pCursor->pVtab[1].pModule)->xDestroy)(pCursor[2].pVtab);
  if (iVar1 == 0) {
    iVar2 = 0;
  }
  else {
    fts3tokResetCursor((Fts3tokCursor *)pCursor);
    iVar2 = 0;
    if (iVar1 != 0x65) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

static int fts3tokNextMethod(sqlite3_vtab_cursor *pCursor){
  Fts3tokCursor *pCsr = (Fts3tokCursor *)pCursor;
  Fts3tokTable *pTab = (Fts3tokTable *)(pCursor->pVtab);
  int rc;                         /* Return code */

  pCsr->iRowid++;
  rc = pTab->pMod->xNext(pCsr->pCsr,
      &pCsr->zToken, &pCsr->nToken,
      &pCsr->iStart, &pCsr->iEnd, &pCsr->iPos
  );

  if( rc!=SQLITE_OK ){
    fts3tokResetCursor(pCsr);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }

  return rc;
}